

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

int Fra_FraigMiterAssertedOutput(Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_2c;
  int i;
  Aig_Obj_t *pChild;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_2c = 0;
  do {
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (iVar2 - iVar3 <= local_2c) {
      return -1;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pAVar5 = Aig_ObjChild0(pAVar5);
    pAVar6 = Aig_ManConst0(p);
    if (pAVar5 != pAVar6) {
      pAVar6 = Aig_ManConst1(p);
      if (pAVar5 == pAVar6) {
        return local_2c;
      }
      pAVar6 = Aig_Regular(pAVar5);
      uVar1 = *(ulong *)&pAVar6->field_0x18;
      uVar4 = Aig_IsComplement(pAVar5);
      if (((uint)(uVar1 >> 3) & 1) != uVar4) {
        return local_2c;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Fra_FraigMiterAssertedOutput( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            continue;
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
            return i;
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
            return i;
    }
    return -1;
}